

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O3

void mxx::impl::
     bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (undefined8 begin,undefined8 end,long param_3,int param_4,int param_5,byte param_6)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  double dVar5;
  
  dVar5 = log((double)param_5);
  dVar5 = ceil(dVar5 / 0.6931471805599453);
  dVar5 = exp2(dVar5);
  iVar2 = (int)dVar5 + param_4;
  iVar1 = *(int *)(param_3 + 0x10);
  if (iVar2 < *(int *)(param_3 + 0x10)) {
    iVar1 = iVar2;
  }
  if (iVar1 - param_4 < 2) {
    return;
  }
  iVar2 = (int)dVar5 / 2;
  iVar3 = iVar2 + param_4;
  if (*(int *)(param_3 + 0x14) < iVar3) {
    iVar3 = param_4;
    bVar4 = param_6 ^ 1;
  }
  else {
    iVar2 = param_5 - iVar2;
    bVar4 = param_6;
  }
  bitonic_sort_rec<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (begin,end,param_3,iVar3,iVar2,bVar4);
  bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (begin,end,param_3,param_4,iVar1,param_6);
  return;
}

Assistant:

void bitonic_sort_rec(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int pbeg, int size, bool dir) {

    // get next power of two
    int p2 = pow(2, ceil(log(size)/log(2)));

    // determine where the two sub-recursions are
    int pmid = pbeg + p2/2;
    int pend = pbeg + p2;
    if (pend > comm.size())
        pend = comm.size();
    // recursive base-case
    if (pend - pbeg <= 1)
        return;

    // sort the two subsequences, where the first is always a power of 2
    if (comm.rank() < pmid) {
        // sort descending
        bitonic_sort_rec(begin, end, comp, comm, pbeg, p2/2, !dir);
    } else {
        // sort ascending
        bitonic_sort_rec(begin, end, comp, comm, pmid, size - p2/2, dir);
    }
    // merge bitonic decreasing sequence
    bitonic_merge(begin, end, comp, comm, pbeg, pend, dir);
}